

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineStateBase.hpp
# Opt level: O3

void Diligent::PipelineStateUtils::
     ExtractShaders<Diligent::ShaderVkImpl,std::vector<Diligent::PipelineStateVkImpl::ShaderStageInfo,std::allocator<Diligent::PipelineStateVkImpl::ShaderStageInfo>>>
               (RayTracingPipelineStateCreateInfo *CreateInfo,
               vector<Diligent::PipelineStateVkImpl::ShaderStageInfo,_std::allocator<Diligent::PipelineStateVkImpl::ShaderStageInfo>_>
               *ShaderStages,bool WaitUntilShadersReady,SHADER_TYPE *ActiveShaderStages)

{
  Int32 IVar1;
  size_t sVar2;
  iterator __position;
  char (*Args_1) [22];
  long lVar3;
  ulong uVar4;
  anon_class_32_4_a6542874 AddShader;
  string msg_1;
  unordered_set<Diligent::IShader_*,_std::hash<Diligent::IShader_*>,_std::equal_to<Diligent::IShader_*>,_std::allocator<Diligent::IShader_*>_>
  UniqueShaders;
  anon_class_32_4_a6542874 local_a8;
  string local_88;
  undefined1 local_68 [32];
  float local_48;
  size_t local_40;
  __node_base_ptr p_Stack_38;
  
  Args_1 = (char (*) [22])ActiveShaderStages;
  if ((CreateInfo->super_PipelineStateCreateInfo).PSODesc.PipelineType != PIPELINE_TYPE_RAY_TRACING)
  {
    FormatString<char[26],char[42]>
              ((string *)local_68,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"CreateInfo.PSODesc.IsRayTracingPipeline()",
               (char (*) [42])ActiveShaderStages);
    Args_1 = (char (*) [22])0x118;
    DebugAssertionFailed
              ((Char *)local_68._0_8_,"ExtractShaders",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/PipelineStateBase.hpp"
               ,0x118);
    if ((undefined1 *)local_68._0_8_ != local_68 + 0x10) {
      operator_delete((void *)local_68._0_8_,local_68._16_8_ + 1);
    }
  }
  local_68._0_8_ = &p_Stack_38;
  local_68._8_8_ = 1;
  local_68._16_8_ = 0;
  local_68._24_8_ = 0;
  local_48 = 1.0;
  local_40 = 0;
  p_Stack_38 = (__node_base_ptr)0x0;
  local_a8.UniqueShaders =
       (unordered_set<Diligent::IShader_*,_std::hash<Diligent::IShader_*>,_std::equal_to<Diligent::IShader_*>,_std::allocator<Diligent::IShader_*>_>
        *)local_68;
  local_a8.ShaderStages = ShaderStages;
  local_a8.ActiveShaderStages = ActiveShaderStages;
  local_a8.WaitUntilShadersReady = WaitUntilShadersReady;
  std::
  vector<Diligent::PipelineStateVkImpl::ShaderStageInfo,_std::allocator<Diligent::PipelineStateVkImpl::ShaderStageInfo>_>
  ::_M_erase_at_end(ShaderStages,
                    (ShaderStages->
                    super__Vector_base<Diligent::PipelineStateVkImpl::ShaderStageInfo,_std::allocator<Diligent::PipelineStateVkImpl::ShaderStageInfo>_>
                    )._M_impl.super__Vector_impl_data._M_start);
  std::
  vector<Diligent::PipelineStateVkImpl::ShaderStageInfo,_std::allocator<Diligent::PipelineStateVkImpl::ShaderStageInfo>_>
  ::resize(ShaderStages,6);
  *ActiveShaderStages = SHADER_TYPE_UNKNOWN;
  if (CreateInfo->GeneralShaderCount != 0) {
    lVar3 = 8;
    uVar4 = 0;
    do {
      ExtractShaders<Diligent::ShaderVkImpl,_std::vector<Diligent::PipelineStateVkImpl::ShaderStageInfo,_std::allocator<Diligent::PipelineStateVkImpl::ShaderStageInfo>_>_>
      ::anon_class_32_4_a6542874::operator()
                (&local_a8,*(IShader **)((long)&CreateInfo->pGeneralShaders->Name + lVar3));
      uVar4 = uVar4 + 1;
      lVar3 = lVar3 + 0x10;
    } while (uVar4 < CreateInfo->GeneralShaderCount);
  }
  if (CreateInfo->TriangleHitShaderCount != 0) {
    lVar3 = 0;
    uVar4 = 0;
    do {
      ExtractShaders<Diligent::ShaderVkImpl,_std::vector<Diligent::PipelineStateVkImpl::ShaderStageInfo,_std::allocator<Diligent::PipelineStateVkImpl::ShaderStageInfo>_>_>
      ::anon_class_32_4_a6542874::operator()
                (&local_a8,
                 *(IShader **)((long)&CreateInfo->pTriangleHitShaders->pClosestHitShader + lVar3));
      ExtractShaders<Diligent::ShaderVkImpl,_std::vector<Diligent::PipelineStateVkImpl::ShaderStageInfo,_std::allocator<Diligent::PipelineStateVkImpl::ShaderStageInfo>_>_>
      ::anon_class_32_4_a6542874::operator()
                (&local_a8,
                 *(IShader **)((long)&CreateInfo->pTriangleHitShaders->pAnyHitShader + lVar3));
      uVar4 = uVar4 + 1;
      lVar3 = lVar3 + 0x18;
    } while (uVar4 < CreateInfo->TriangleHitShaderCount);
  }
  if (CreateInfo->ProceduralHitShaderCount != 0) {
    lVar3 = 0;
    uVar4 = 0;
    do {
      ExtractShaders<Diligent::ShaderVkImpl,_std::vector<Diligent::PipelineStateVkImpl::ShaderStageInfo,_std::allocator<Diligent::PipelineStateVkImpl::ShaderStageInfo>_>_>
      ::anon_class_32_4_a6542874::operator()
                (&local_a8,
                 *(IShader **)
                  ((long)&CreateInfo->pProceduralHitShaders->pIntersectionShader + lVar3));
      ExtractShaders<Diligent::ShaderVkImpl,_std::vector<Diligent::PipelineStateVkImpl::ShaderStageInfo,_std::allocator<Diligent::PipelineStateVkImpl::ShaderStageInfo>_>_>
      ::anon_class_32_4_a6542874::operator()
                (&local_a8,
                 *(IShader **)((long)&CreateInfo->pProceduralHitShaders->pClosestHitShader + lVar3))
      ;
      ExtractShaders<Diligent::ShaderVkImpl,_std::vector<Diligent::PipelineStateVkImpl::ShaderStageInfo,_std::allocator<Diligent::PipelineStateVkImpl::ShaderStageInfo>_>_>
      ::anon_class_32_4_a6542874::operator()
                (&local_a8,
                 *(IShader **)((long)&CreateInfo->pProceduralHitShaders->pAnyHitShader + lVar3));
      uVar4 = uVar4 + 1;
      lVar3 = lVar3 + 0x20;
    } while (uVar4 < CreateInfo->ProceduralHitShaderCount);
  }
  IVar1 = GetShaderTypePipelineIndex(SHADER_TYPE_RAY_GEN,PIPELINE_TYPE_RAY_TRACING);
  sVar2 = PipelineStateVkImpl::ShaderStageInfo::Count
                    ((ShaderStages->
                     super__Vector_base<Diligent::PipelineStateVkImpl::ShaderStageInfo,_std::allocator<Diligent::PipelineStateVkImpl::ShaderStageInfo>_>
                     )._M_impl.super__Vector_impl_data._M_start + IVar1);
  if (sVar2 == 0) {
    Args_1 = (char (*) [22])0x142;
    LogError<true,char[68]>
              (false,"ExtractShaders",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/PipelineStateBase.hpp"
               ,0x142,(char (*) [68])
                      "At least one shader with type SHADER_TYPE_RAY_GEN must be provided.");
  }
  __position._M_current =
       (ShaderStages->
       super__Vector_base<Diligent::PipelineStateVkImpl::ShaderStageInfo,_std::allocator<Diligent::PipelineStateVkImpl::ShaderStageInfo>_>
       )._M_impl.super__Vector_impl_data._M_start;
  if (__position._M_current !=
      (ShaderStages->
      super__Vector_base<Diligent::PipelineStateVkImpl::ShaderStageInfo,_std::allocator<Diligent::PipelineStateVkImpl::ShaderStageInfo>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    do {
      sVar2 = PipelineStateVkImpl::ShaderStageInfo::Count(__position._M_current);
      if (sVar2 == 0) {
        __position = std::
                     vector<Diligent::PipelineStateVkImpl::ShaderStageInfo,_std::allocator<Diligent::PipelineStateVkImpl::ShaderStageInfo>_>
                     ::_M_erase(ShaderStages,__position);
      }
      else {
        __position._M_current = __position._M_current + 1;
      }
    } while (__position._M_current !=
             (ShaderStages->
             super__Vector_base<Diligent::PipelineStateVkImpl::ShaderStageInfo,_std::allocator<Diligent::PipelineStateVkImpl::ShaderStageInfo>_>
             )._M_impl.super__Vector_impl_data._M_finish);
    if ((ShaderStages->
        super__Vector_base<Diligent::PipelineStateVkImpl::ShaderStageInfo,_std::allocator<Diligent::PipelineStateVkImpl::ShaderStageInfo>_>
        )._M_impl.super__Vector_impl_data._M_start != __position._M_current) goto LAB_00216768;
  }
  FormatString<char[26],char[22]>
            (&local_88,(Diligent *)"Debug expression failed:\n",
             (char (*) [26])"!ShaderStages.empty()",Args_1);
  DebugAssertionFailed
            (local_88._M_dataplus._M_p,"ExtractShaders",
             "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/PipelineStateBase.hpp"
             ,0x151);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
LAB_00216768:
  std::
  _Hashtable<Diligent::IShader_*,_Diligent::IShader_*,_std::allocator<Diligent::IShader_*>,_std::__detail::_Identity,_std::equal_to<Diligent::IShader_*>,_std::hash<Diligent::IShader_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<Diligent::IShader_*,_Diligent::IShader_*,_std::allocator<Diligent::IShader_*>,_std::__detail::_Identity,_std::equal_to<Diligent::IShader_*>,_std::hash<Diligent::IShader_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)local_68);
  return;
}

Assistant:

void ExtractShaders(const RayTracingPipelineStateCreateInfo& CreateInfo,
                    TShaderStages&                           ShaderStages,
                    bool                                     WaitUntilShadersReady,
                    SHADER_TYPE&                             ActiveShaderStages)
{
    VERIFY_EXPR(CreateInfo.PSODesc.IsRayTracingPipeline());

    std::unordered_set<IShader*> UniqueShaders;

    auto AddShader = [&ShaderStages,
                      &UniqueShaders,
                      &ActiveShaderStages,
                      WaitUntilShadersReady](IShader* pShader) {
        if (pShader != nullptr && UniqueShaders.insert(pShader).second)
        {
            const SHADER_TYPE ShaderType = pShader->GetDesc().ShaderType;
            const Int32       StageInd   = GetShaderTypePipelineIndex(ShaderType, PIPELINE_TYPE_RAY_TRACING);
            auto&             Stage      = ShaderStages[StageInd];
            ActiveShaderStages |= ShaderType;
            RefCntAutoPtr<ShaderImplType> pShaderImpl{pShader, ShaderImplType::IID_InternalImpl};
            VERIFY(pShaderImpl, "Unexpected shader object implementation");
            WaitUntilShaderReadyIfRequested(pShaderImpl, WaitUntilShadersReady);
            Stage.Append(pShaderImpl);
        }
    };

    ShaderStages.clear();
    ShaderStages.resize(MAX_SHADERS_IN_PIPELINE);
    ActiveShaderStages = SHADER_TYPE_UNKNOWN;

    for (Uint32 i = 0; i < CreateInfo.GeneralShaderCount; ++i)
    {
        AddShader(CreateInfo.pGeneralShaders[i].pShader);
    }
    for (Uint32 i = 0; i < CreateInfo.TriangleHitShaderCount; ++i)
    {
        AddShader(CreateInfo.pTriangleHitShaders[i].pClosestHitShader);
        AddShader(CreateInfo.pTriangleHitShaders[i].pAnyHitShader);
    }
    for (Uint32 i = 0; i < CreateInfo.ProceduralHitShaderCount; ++i)
    {
        AddShader(CreateInfo.pProceduralHitShaders[i].pIntersectionShader);
        AddShader(CreateInfo.pProceduralHitShaders[i].pClosestHitShader);
        AddShader(CreateInfo.pProceduralHitShaders[i].pAnyHitShader);
    }

    if (ShaderStages[GetShaderTypePipelineIndex(SHADER_TYPE_RAY_GEN, PIPELINE_TYPE_RAY_TRACING)].Count() == 0)
        LOG_ERROR_AND_THROW("At least one shader with type SHADER_TYPE_RAY_GEN must be provided.");

    // Remove empty stages
    for (auto iter = ShaderStages.begin(); iter != ShaderStages.end();)
    {
        if (iter->Count() == 0)
        {
            iter = ShaderStages.erase(iter);
        }
        else
        {
            ++iter;
        }
    }

    VERIFY_EXPR(!ShaderStages.empty());
}